

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsMTimes(void *arkode_mem,N_Vector v,N_Vector z)

{
  SUNMatrix A;
  int iVar1;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLsMTimes",&ark_mem,&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (arkls_mem->mtimes == (ARKLsMassTimesVecFn)0x0) {
    A = arkls_mem->M;
    if ((A == (SUNMatrix)0x0) || (A->ops->matvec == (_func_int_SUNMatrix_N_Vector_N_Vector *)0x0)) {
      arkProcessError(ark_mem,0,"ARKLS","arkLsMTimes","Missing mass matrix-vector product routine");
      return -1;
    }
    iVar1 = SUNMatMatvec(A,v,z);
    if (iVar1 == 0) goto LAB_003ba896;
    msgfmt = "Error in SUNMatrix mass matrix-vector product routine";
  }
  else {
    iVar1 = (*arkls_mem->mtimes)(v,z,ark_mem->tcur,arkls_mem->mt_data);
    if (iVar1 == 0) {
LAB_003ba896:
      arkls_mem->nmtimes = arkls_mem->nmtimes + 1;
      return 0;
    }
    msgfmt = "Error in user mass matrix-vector product routine";
  }
  arkProcessError(ark_mem,iVar1,"ARKLS","arkLsMTimes",msgfmt);
  return iVar1;
}

Assistant:

int arkLsMTimes(void *arkode_mem, N_Vector v, N_Vector z)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMTimes",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* perform multiply by either calling the user-supplied routine
     (default), or asking the SUNMatrix to do the multiply */
  if (arkls_mem->mtimes) {

    /* call user-supplied mtimes routine, increment counter and return */
    retval = arkls_mem->mtimes(v, z, ark_mem->tcur,
                               arkls_mem->mt_data);
    if (retval == 0) {
      arkls_mem->nmtimes++;
    } else {
      arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                      "Error in user mass matrix-vector product routine");
    }
    return(retval);

  } else if (arkls_mem->M) {

    /* try to ask SUNMatrix to do the multiply; increment counter and return */
    if (arkls_mem->M->ops->matvec) {
      retval = SUNMatMatvec(arkls_mem->M, v, z);
      if (retval == 0) {
        arkls_mem->nmtimes++;
      } else {
        arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                        "Error in SUNMatrix mass matrix-vector product routine");
      }
      return(retval);
    }

  }

  /* if we made it here, then no matrix-vector product is available */
  arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                  "Missing mass matrix-vector product routine");
  return(-1);
}